

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O0

string * __thiscall
flow::diagnostics::Message::string_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string *psVar1;
  basic_string_view<char> local_48;
  basic_string_view<char> local_38;
  basic_string_view<char> local_28;
  Message *local_18;
  Message *this_local;
  
  local_18 = this;
  this_local = (Message *)__return_storage_ptr__;
  if (this->type == Warning) {
    psVar1 = __return_storage_ptr__;
    fmt::v5::basic_string_view<char>::basic_string_view(&local_28,"[{}] {}");
    format_str.size_ = &this->sourceLocation;
    format_str.data_ = (char *)local_28.size_;
    fmt::v5::format<flow::SourceLocation,std::__cxx11::string>
              (psVar1,(v5 *)local_28.data_,format_str,(SourceLocation *)&this->text,in_R9);
  }
  else if (this->type == LinkError) {
    psVar1 = __return_storage_ptr__;
    fmt::v5::basic_string_view<char>::basic_string_view(&local_38,"{}: {}");
    format_str_00.size_ = (size_t)this;
    format_str_00.data_ = (char *)local_38.size_;
    fmt::v5::format<flow::diagnostics::Type,std::__cxx11::string>
              (psVar1,(v5 *)local_38.data_,format_str_00,(Type *)&this->text,in_R9);
  }
  else {
    psVar1 = __return_storage_ptr__;
    fmt::v5::basic_string_view<char>::basic_string_view(&local_48,"[{}] {}: {}");
    format_str_01.size_ = &this->sourceLocation;
    format_str_01.data_ = (char *)local_48.size_;
    fmt::v5::format<flow::SourceLocation,flow::diagnostics::Type,std::__cxx11::string>
              (psVar1,(v5 *)local_48.data_,format_str_01,(SourceLocation *)this,(Type *)&this->text,
               psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Message::string() const {
  switch (type) {
    case Type::Warning:
      return fmt::format("[{}] {}", sourceLocation, text);
    case Type::LinkError:
      return fmt::format("{}: {}", type, text);
    default:
      return fmt::format("[{}] {}: {}", sourceLocation, type, text);
  }
}